

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_config.c
# Opt level: O1

int mk_config_listen_parse(char *value,mk_server *server)

{
  uint flags;
  mk_list *list;
  char *pcVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  uint uVar4;
  mk_list *pmVar5;
  mk_list *pmVar6;
  mk_list *pmVar7;
  int iVar8;
  
  list = mk_string_split_line(value);
  iVar8 = -1;
  if (list == (mk_list *)0x0) {
    list = (mk_list *)0x0;
  }
  else {
    pmVar7 = list->next;
    if (pmVar7 != list) {
      pmVar6 = pmVar7[-1].prev;
      uVar4 = (uint)pmVar6;
      if (*(char *)&pmVar6->prev == '[') {
        pcVar1 = strchr((char *)pmVar6,0x5d);
        if (pcVar1 == (char *)0x0) {
          pcVar1 = "[config] Expected closing \']\' in IPv6 address.";
        }
        else {
          if ((pcVar1[1] == ':') && (pcVar1[2] != '\0')) {
            pmVar5 = (mk_list *)(pcVar1 + 2);
            pmVar6 = (mk_list *)((long)&pmVar6->prev + 1);
            iVar8 = ~uVar4 + (int)pcVar1;
LAB_0010973c:
            pcVar1 = mk_string_copy_substr((char *)pmVar6,0,iVar8);
            pmVar6 = pmVar5;
            goto LAB_001097ba;
          }
          pcVar1 = "[config] Expected \':port\' after IPv6 address.";
        }
      }
      else {
        pcVar1 = strchr((char *)pmVar6,0x3a);
        if (pcVar1 == (char *)0x0) {
          pcVar1 = (char *)0x0;
LAB_001097ba:
          __nptr = mk_string_dup((char *)pmVar6);
          piVar2 = __errno_location();
          *piVar2 = 0;
          lVar3 = strtol(__nptr,(char **)0x0,10);
          pmVar6 = list;
          if ((*piVar2 != 0) || (lVar3 + 0x8000000000000001U < 2)) {
            __nptr = (char *)0x0;
            mk_print(0x1002,"Using defaults, could not understand \"Listen %s\"",pmVar7[-1].prev);
          }
          do {
            pmVar6 = pmVar6->next;
            pmVar7 = list;
            if (pmVar6 == list) {
              uVar4 = 1;
              goto LAB_0010984f;
            }
            iVar8 = strcasecmp((char *)pmVar6[-1].prev,"!http");
          } while (iVar8 != 0);
          uVar4 = 0xffffffff;
LAB_0010984f:
          do {
            pmVar7 = pmVar7->next;
            if (pmVar7 == list) break;
            iVar8 = strcasecmp((char *)pmVar7[-1].prev,"tls");
          } while (iVar8 != 0);
          flags = uVar4 | 8;
          if (pmVar7 == list) {
            flags = uVar4;
          }
          mk_config_listener_add(pcVar1,__nptr,flags,server);
          mk_string_split_free(list);
          list = (mk_list *)0x0;
          iVar8 = 0;
          goto LAB_0010977b;
        }
        pcVar1 = strrchr((char *)pmVar6,0x3a);
        if ((pcVar1 != (char *)0x0) && (pcVar1[1] != '\0')) {
          pmVar5 = (mk_list *)(pcVar1 + 1);
          iVar8 = (int)pcVar1 - uVar4;
          goto LAB_0010973c;
        }
        pcVar1 = "[config] Expected \':port\' after IPv4 address.";
      }
      mk_print(0x1001,pcVar1);
    }
  }
  __nptr = (char *)0x0;
  pcVar1 = (char *)0x0;
LAB_0010977b:
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  if (__nptr != (char *)0x0) {
    free(__nptr);
  }
  if (list != (mk_list *)0x0) {
    mk_string_split_free(list);
  }
  return iVar8;
}

Assistant:

int mk_config_listen_parse(char *value, struct mk_server *server)
{
    int ret = -1;
    int flags = 0;
    long port_num;
    char *address = NULL;
    char *port = NULL;
    char *divider;
    struct mk_list *list = NULL;
    struct mk_string_line *listener;

    list = mk_string_split_line(value);
    if (!list) {
        goto error;
    }

    if (mk_list_is_empty(list) == 0) {
        goto error;
    }

    /* Parse the listener interface */
    listener = mk_list_entry_first(list, struct mk_string_line, _head);
    if (listener->val[0] == '[') {
        /* IPv6 address */
        divider = strchr(listener->val, ']');
        if (divider == NULL) {
            mk_err("[config] Expected closing ']' in IPv6 address.");
            goto error;
        }
        if (divider[1] != ':' || divider[2] == '\0') {
            mk_err("[config] Expected ':port' after IPv6 address.");
            goto error;
        }

        address = mk_string_copy_substr(listener->val + 1, 0,
                                        divider - listener->val - 1);
        port = mk_string_dup(divider + 2);
    }
    else if (strchr(listener->val, ':') != NULL) {
        /* IPv4 address */
        divider = strrchr(listener->val, ':');
        if (divider == NULL || divider[1] == '\0') {
            mk_err("[config] Expected ':port' after IPv4 address.");
            goto error;
        }

        address = mk_string_copy_substr(listener->val, 0,
                                        divider - listener->val);
        port = mk_string_dup(divider + 1);
    }
    else {
        /* Port only */
        address = NULL;
        port = mk_string_dup(listener->val);
    }

    errno = 0;
    port_num = strtol(port, NULL, 10);
    if (errno != 0 || port_num == LONG_MAX || port_num == LONG_MIN) {
        mk_warn("Using defaults, could not understand \"Listen %s\"",
                listener->val);
        port = NULL;
    }

    /* Check extra properties of the listener */
    flags = MK_CAP_HTTP;
    if (mk_config_key_have(list, "!http")) {
        flags |= ~MK_CAP_HTTP;
    }

#ifdef MK_HAVE_HTTP2
    if (mk_config_key_have(list, "h2")) {
        flags |= (MK_CAP_HTTP2 | MK_CAP_SOCK_TLS);
    }

    if (mk_config_key_have(list, "h2c")) {
        flags |= MK_CAP_HTTP2;
    }
#endif

    if (mk_config_key_have(list, "tls")) {
        flags |= MK_CAP_SOCK_TLS;
    }

    /* register the new listener */
    mk_config_listener_add(address, port, flags, server);
    mk_string_split_free(list);
    list = NULL;
    ret = 0;

error:
    if (address) {
        mk_mem_free(address);
    }
    if (port) {
        mk_mem_free(port);
    }
    if (list) {
        mk_string_split_free(list);
    }

    return ret;
}